

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

bool gch::operator==(small_vector<int,_6U,_std::allocator<int>_> *lhs,
                    small_vector<int,_6U,_std::allocator<int>_> *rhs)

{
  size_ty sVar1;
  small_vector_iterator<const_int_*,_long> __first1;
  bool bVar2;
  difference_type __d;
  
  sVar1 = (lhs->super_small_vector_base<std::allocator<int>,_6U>).m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  if (sVar1 == (rhs->super_small_vector_base<std::allocator<int>,_6U>).m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size) {
    __first1.m_ptr =
         (lhs->super_small_vector_base<std::allocator<int>,_6U>).m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    bVar2 = std::__equal<false>::
            equal<gch::small_vector_iterator<int_const*,long>,gch::small_vector_iterator<int_const*,long>>
                      (__first1,(small_vector_iterator<const_int_*,_long>)(__first1.m_ptr + sVar1),
                       (small_vector_iterator<const_int_*,_long>)
                       (rhs->super_small_vector_base<std::allocator<int>,_6U>).m_data.
                       super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr);
    return bVar2;
  }
  return false;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }